

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall preprocessor_test_for_Test::TestBody(preprocessor_test_for_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  char for_str [43];
  AssertHelper local_68;
  Message local_60 [3];
  AssertionResult local_48;
  char local_38 [56];
  
  builtin_strncpy(local_38 + 0x20,"4e-yeet5f-",0xb);
  builtin_strncpy(local_38 + 0x10,"et2c-yeet3d-yeet",0x10);
  builtin_strncpy(local_38,"yeet0a-yeet1b-ye",0x10);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_48,"for_str","\"yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-\"",
             local_38,"yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x110734);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xac,message);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x110782);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1107c2);
  return;
}

Assistant:

TEST_F(preprocessor_test, for)
{
#define PREPROCESSOR_TEST_FOR(context, iterator, element) \
	context \
		PREPROCESSOR_STRINGIFY(iterator) \
			element \
		"-"

	const char for_str[] = PREPROCESSOR_FOR(PREPROCESSOR_TEST_FOR, "yeet", "a", "b", "c", "d", "e", "f");

#undef PREPROCESSOR_TEST_FOR

	EXPECT_STREQ(for_str, "yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-");
}